

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

int __thiscall BoardView::LoadFile(BoardView *this,path *filepath)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar4;
  FZFile *this_00;
  undefined4 extraout_var_04;
  shared_ptr<Pin> *p;
  vector<char,_std::allocator<char>_> buffer;
  path conffilepath;
  string local_f8;
  path local_d8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_03;
  
  this->m_lastFileOpenWasInvalid = true;
  this->m_validBoard = false;
  if ((filepath->_M_pathname)._M_string_length == 0) {
    return 1;
  }
  if (this->m_file != (BRDFileBase *)0x0) {
    if (this->m_board != (Board *)0x0) {
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
                (&this->m_pinHighlighted);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
                (&this->m_partHighlighted);
      Annotations::Close(&this->m_annotations);
      iVar3 = (*this->m_board->_vptr_Board[2])();
      std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
                ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                 CONCAT44(extraout_var,iVar3));
      iVar3 = (*this->m_board->_vptr_Board[4])();
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                 CONCAT44(extraout_var_00,iVar3));
      iVar3 = (*this->m_board->_vptr_Board[3])();
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
                ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )CONCAT44(extraout_var_01,iVar3));
      iVar3 = (*this->m_board->_vptr_Board[5])();
      std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
                ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                 CONCAT44(extraout_var_02,iVar3));
      iVar3 = (*this->m_board->_vptr_Board[6])();
      plVar4 = (long *)CONCAT44(extraout_var_03,iVar3);
      if (plVar4[1] != *plVar4) {
        plVar4[1] = *plVar4;
      }
    }
    if (this->m_file != (BRDFileBase *)0x0) {
      (*this->m_file->_vptr_BRDFileBase[1])();
    }
  }
  this->m_file = (BRDFileBase *)0x0;
  this->m_validBoard = false;
  (this->m_error_msg)._M_string_length = 0;
  *(this->m_error_msg)._M_dataplus._M_p = '\0';
  PDFBridgeEvince::CloseDocument(&this->pdfBridge);
  std::filesystem::__cxx11::path::string(&conffilepath._M_pathname,filepath);
  std::__cxx11::string::_M_assign((string *)&this->m_lastFileOpenName);
  std::__cxx11::string::~string((string *)&conffilepath);
  file_as_buffer(&buffer,filepath,&this->m_error_msg);
  if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_0010f85c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,".fz",(allocator<char> *)&conffilepath);
  bVar2 = check_fileext(filepath,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    this_00 = (FZFile *)operator_new(0x188);
    memset(this_00,0,0x188);
    FZFile::FZFile(this_00);
    FZFile::parse(this_00,&buffer,&(this->config).FZKey);
LAB_0010f709:
    this->m_file = &this_00->super_BRDFileBase;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,".cae",(allocator<char> *)&conffilepath);
    bVar2 = check_fileext(filepath,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0x188);
      memset(this_00,0,0x188);
      CAEFile::CAEFile((CAEFile *)this_00);
      FZFile::parse(this_00,&buffer,&(this->config).CAEKey);
      goto LAB_0010f709;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,".bom",(allocator<char> *)&conffilepath);
    bVar2 = check_fileext(filepath,&local_f8);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_f8);
LAB_0010f6ee:
      this_00 = (FZFile *)operator_new(200);
      ASCFile::ASCFile((ASCFile *)this_00,&buffer,filepath);
      goto LAB_0010f709;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,".asc",(allocator<char> *)&local_d8);
    bVar2 = check_fileext(filepath,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f8);
    if (bVar2) goto LAB_0010f6ee;
    bVar2 = GenCADFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0x138);
      GenCADFile::GenCADFile((GenCADFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = ADFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0x110);
      ADFile::ADFile((ADFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = CADFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      CADFile::CADFile((CADFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,".cst",(allocator<char> *)&conffilepath);
    bVar2 = check_fileext(filepath,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xe0);
      CSTFile::CSTFile((CSTFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = BRDFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      BRDFile::BRDFile((BRDFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = BRD2File::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      BRD2File::BRD2File((BRD2File *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = BDVFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      BDVFile::BDVFile((BDVFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = BVRFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      BVRFile::BVRFile((BVRFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = BVR3File::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      BVR3File::BVR3File((BVR3File *)this_00,&buffer);
      goto LAB_0010f709;
    }
    bVar2 = BRDAllegroFile::verifyFormat(&buffer);
    if (bVar2) {
      this_00 = (FZFile *)operator_new(0xc0);
      BRDAllegroFile::BRDAllegroFile((BRDAllegroFile *)this_00,&buffer);
      goto LAB_0010f709;
    }
    std::__cxx11::string::assign((char *)&this->m_error_msg);
    this_00 = (FZFile *)this->m_file;
    if (this_00 == (FZFile *)0x0) goto LAB_0010f85c;
  }
  if ((this_00->super_BRDFileBase).valid == true) {
    LoadBoard(this,&this_00->super_BRDFileBase);
    std::filesystem::__cxx11::path::string(&conffilepath._M_pathname,filepath);
    FHistory::Prepend_save(&this->fhistory,&conffilepath._M_pathname);
    std::__cxx11::string::~string((string *)&conffilepath);
    this->history_file_has_changed = 1;
    this->boardMinMaxDone = false;
    this->m_rotation = 0;
    this->m_current_side = 0;
    EPCCheck(this);
    std::filesystem::__cxx11::path::string(&conffilepath._M_pathname,filepath);
    Annotations::SetFilename(&this->m_annotations,&conffilepath._M_pathname);
    std::__cxx11::string::~string((string *)&conffilepath);
    Annotations::Load(&this->m_annotations);
    std::filesystem::__cxx11::path::path(&conffilepath,filepath);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_d8,(char (*) [5])0x1c0e4e,auto_format);
    std::filesystem::__cxx11::path::replace_extension(&conffilepath);
    std::filesystem::__cxx11::path::~path(&local_d8);
    BackgroundImage::loadFromConfig(&this->backgroundImage,&conffilepath);
    PDFFile::loadFromConfig(&this->pdfFile,&conffilepath);
    PDFBridgeEvince::OpenDocument(&this->pdfBridge,&this->pdfFile);
    iVar3 = (*this->m_board->_vptr_Board[4])();
    plVar1 = (long *)((undefined8 *)CONCAT44(extraout_var_04,iVar3))[1];
    for (plVar4 = *(long **)CONCAT44(extraout_var_04,iVar3); plVar4 != plVar1; plVar4 = plVar4 + 2)
    {
      *(undefined4 *)(*plVar4 + 0x58) = 0x40e00000;
    }
    CenterView(this);
    this->m_lastFileOpenWasInvalid = false;
    this->m_validBoard = true;
    (this->m_error_msg)._M_string_length = 0;
    *(this->m_error_msg)._M_dataplus._M_p = '\0';
    std::filesystem::__cxx11::path::~path(&conffilepath);
  }
LAB_0010f85c:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return 0;
}

Assistant:

int BoardView::LoadFile(const filesystem::path &filepath) {
	m_lastFileOpenWasInvalid = true;
	m_validBoard             = false;
	if (!filepath.empty()) {
		// clean up the previous file.
		if (m_file && m_board) {
			m_pinHighlighted.clear();
			m_partHighlighted.clear();
			m_annotations.Close();
			m_board->Nets().clear();
			m_board->Pins().clear();
			m_board->Components().clear();
			m_board->OutlinePoints().clear();
			m_board->OutlineSegments().clear();
			//	delete m_file;
			// delete m_board;
		}
		delete m_file;
		m_file = nullptr;
		m_validBoard = false;
		m_error_msg.clear();
		pdfBridge.CloseDocument();

		SetLastFileOpenName(filepath.string());
		std::vector<char> buffer = file_as_buffer(filepath, m_error_msg);
		if (!buffer.empty()) {
			if (check_fileext(filepath, ".fz")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				FZFile *fzfile = new FZFile();
				fzfile->parse(buffer, config.FZKey);
				m_file = fzfile;
			} else if (check_fileext(filepath, ".cae")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				CAEFile *caefile = new CAEFile();
				caefile->parse(buffer, config.CAEKey);
				m_file = caefile;
			} else if (check_fileext(filepath, ".bom") || check_fileext(filepath, ".asc"))
				m_file = new ASCFile(buffer, filepath);
			else if (GenCADFile::verifyFormat(buffer))
				m_file = new GenCADFile(buffer);
			else if (ADFile::verifyFormat(buffer))
				m_file = new ADFile(buffer);
			else if (CADFile::verifyFormat(buffer))
				m_file = new CADFile(buffer);
			else if (check_fileext(filepath, ".cst"))
				m_file = new CSTFile(buffer);
			else if (BRDFile::verifyFormat(buffer))
				m_file = new BRDFile(buffer);
			else if (BRD2File::verifyFormat(buffer))
				m_file = new BRD2File(buffer);
			else if (BDVFile::verifyFormat(buffer))
				m_file = new BDVFile(buffer);
			else if (BVRFile::verifyFormat(buffer))
				m_file = new BVRFile(buffer);
			else if (BVR3File::verifyFormat(buffer))
				m_file = new BVR3File(buffer);
			else if (BRDAllegroFile::verifyFormat(buffer))
				m_file = new BRDAllegroFile(buffer);
			else
				m_error_msg = "Unrecognized file format.";

			if (m_file && m_file->valid) {
				LoadBoard(m_file);
				fhistory.Prepend_save(filepath.string());
				history_file_has_changed = 1; // used by main to know when to update the window title
				boardMinMaxDone          = false;
				m_rotation               = 0;
				m_current_side           = 0;
				EPCCheck(); // check to see we don't have a flipped board outline

				m_annotations.SetFilename(filepath.string());
				m_annotations.Load();

				auto conffilepath = filepath;
				conffilepath.replace_extension("conf");
				backgroundImage.loadFromConfig(conffilepath);
				pdfFile.loadFromConfig(conffilepath);

				pdfBridge.OpenDocument(pdfFile);

				/*
				 * Set pins to a known lower size, they get resized
				 * in DrawParts() when the component is analysed
				 */
				for (auto &p : m_board->Pins()) {
					//					auto p      = pin.get();
					p->diameter = 7;
				}

				CenterView();
				m_lastFileOpenWasInvalid = false;
				m_validBoard             = true;
				m_error_msg.clear();
			}
		}
	} else {
		return 1;
	}

	return 0;
}